

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn.h
# Opt level: O2

uint __thiscall asn1::MemBuffer::read<unsigned_int>(MemBuffer *this)

{
  uint64_t uVar1;
  pointer puVar2;
  long lVar3;
  uint local_c [2];
  uint t;
  
  uVar1 = this->readpos;
  puVar2 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + uVar1 + 3;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    *(uchar *)((long)local_c + lVar3) = *puVar2;
    puVar2 = puVar2 + -1;
  }
  this->readpos = uVar1 + 4;
  return local_c[0];
}

Assistant:

T read()
    {
        T t;
        uint8_t* p = (uint8_t*)&t;
        for (unsigned i = 0; i < sizeof(T); i++)
            p[i] = data[readpos + sizeof(T) - 1 - i];
        readpos += sizeof(T);
        return t;
    }